

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cwebp.c
# Opt level: O2

int WriteMetadataChunk(FILE *out,char *fourcc,MetadataPayload *payload)

{
  size_t sVar1;
  int iVar2;
  ulong in_RAX;
  size_t sVar3;
  ulong __size;
  uint uVar4;
  ulong uStack_28;
  uint8_t zero;
  
  uStack_28 = in_RAX & 0xffffffffffffff;
  sVar1 = payload->size;
  sVar3 = fwrite(fourcc,4,1,(FILE *)out);
  uVar4 = 0;
  if (sVar3 == 1) {
    iVar2 = WriteLE32(out,(uint32_t)payload->size);
    if (iVar2 != 0) {
      sVar3 = fwrite(payload->bytes,payload->size,1,(FILE *)out);
      if (sVar3 == 1) {
        __size = (ulong)((uint)sVar1 & 1);
        sVar3 = fwrite(&zero,__size,__size,(FILE *)out);
        uVar4 = (uint)(sVar3 == __size);
      }
    }
  }
  return uVar4;
}

Assistant:

static int WriteMetadataChunk(FILE* const out, const char fourcc[4],
                              const MetadataPayload* const payload) {
  const uint8_t zero = 0;
  const size_t need_padding = payload->size & 1;
  int ok = (fwrite(fourcc, kTagSize, 1, out) == 1);
  ok = ok && WriteLE32(out, (uint32_t)payload->size);
  ok = ok && (fwrite(payload->bytes, payload->size, 1, out) == 1);
  return ok && (fwrite(&zero, need_padding, need_padding, out) == need_padding);
}